

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *this_00;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  string verification;
  string function_use;
  string function_definition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string iterator_declaration;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_b0;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_a0;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  bool test_compute;
  size_t num_var_types;
  test_var_type *var_types_set;
  string local_70 [8];
  string iteration_loop_start;
  allocator<char> local_39;
  string local_38 [8];
  string iteration_loop_end;
  TestShaderType tested_shader_type_local;
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  iteration_loop_end.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,(allocator<char> *)((long)&var_types_set + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_types_set + 7));
  bVar3 = iteration_loop_end.field_2._12_4_ == 2;
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0xa < var_iterator._M_node) {
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_38);
      return;
    }
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_es + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_a0,&local_a8);
    iterator_declaration.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_b0,(iterator *)((long)&iterator_declaration.field_2 + 8));
    bVar1 = std::operator!=(&local_a0,&local_b0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&function_definition.field_2 + 8),"    ",&(ppVar2->second).iterator_type);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&function_definition.field_2 + 8)," iterator = ");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_f8,&local_118,&(ppVar2->second).iterator_initialization);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &local_f8,";\n");
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)(function_definition.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(function_use.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(verification.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_198);
    std::__cxx11::string::operator=
              ((string *)(function_use.field_2._M_local_buf + 8),"void my_function(out ");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&ppVar2->second);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),
               " output_array[2][2][2][2][2][2][2][2]) {\n");
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)local_d8);
    std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),local_70);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_1d8,
                   "                                   output_array[a][b][c][d][e][f][g][h] = ",
                   &(ppVar2->second).variable_type_initializer1);
    std::operator+(&local_1b8,&local_1d8,";\n");
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_218,"                                   iterator += ",
                   &(ppVar2->second).iterator_type);
    std::operator+(&local_1f8,&local_218,"(1);\n");
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),local_38);
    std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),"}");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_258,"    ",&(ppVar2->second).type);
    std::operator+(&local_238,&local_258," my_array[2][2][2][2][2][2][2][2];\n");
    std::__cxx11::string::operator=
              ((string *)(verification.field_2._M_local_buf + 8),(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),"    my_function(my_array);");
    std::__cxx11::string::operator=((string *)local_198,(string *)local_d8);
    std::__cxx11::string::operator+=((string *)local_198,"    float result = 1.0;\n");
    std::__cxx11::string::operator+=((string *)local_198,local_70);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_2d8,
                   "                                   if (my_array[a][b][c][d][e][f][g][h] ",
                   &(ppVar2->second).specific_element);
    std::operator+(&local_2b8,&local_2d8,
                   " != iterator)\n                                   {\n                                       result = 0.0;\n                                   }\n                                   iterator += "
                  );
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_298,&local_2b8,&(ppVar2->second).iterator_type);
    std::operator+(&local_278,&local_298,"(1);\n");
    std::__cxx11::string::operator+=((string *)local_198,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::operator+=((string *)local_198,local_38);
    if (bVar3) {
      execute_dispatch_test
                (this,iteration_loop_end.field_2._12_4_,(string *)((long)&function_use.field_2 + 8),
                 (string *)((long)&verification.field_2 + 8),(string *)local_198);
    }
    else {
      execute_draw_test(this,iteration_loop_end.field_2._12_4_,
                        (string *)((long)&function_use.field_2 + 8),
                        (string *)((long)&verification.field_2 + 8),(string *)local_198);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[5])();
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)(verification.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(function_use.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_d8);
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x11cf);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionFunctionCalls1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4 };
	static const size_t num_var_types_es = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4,  VAR_TYPE_DOUBLE,
															 VAR_TYPE_DMAT2, VAR_TYPE_DMAT3, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string iterator_declaration = "    " + var_iterator->second.iterator_type +
											   " iterator = " + var_iterator->second.iterator_initialization + ";\n";

			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition = "void my_function(out ";
			function_definition += var_iterator->second.type;
			function_definition += " output_array[2][2][2][2][2][2][2][2]) {\n";
			function_definition += iterator_declaration;
			function_definition += iteration_loop_start;
			function_definition += "                                   output_array[a][b][c][d][e][f][g][h] = " +
								   var_iterator->second.variable_type_initializer1 + ";\n";
			function_definition +=
				"                                   iterator += " + var_iterator->second.iterator_type + "(1);\n";
			function_definition += iteration_loop_end;
			function_definition += "}";

			function_use = "    " + var_iterator->second.type + " my_array[2][2][2][2][2][2][2][2];\n";
			function_use += "    my_function(my_array);";

			verification = iterator_declaration;
			verification += "    float result = 1.0;\n";
			verification += iteration_loop_start;
			verification += "                                   if (my_array[a][b][c][d][e][f][g][h] " +
							var_iterator->second.specific_element +
							" != iterator)\n"
							"                                   {\n"
							"                                       result = 0.0;\n"
							"                                   }\n"
							"                                   iterator += " +
							var_iterator->second.iterator_type + "(1);\n";
			verification += iteration_loop_end;

			if (false == test_compute)
			{
				execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}